

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkItem>
          (cmComputeLinkDepends *this,size_t depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libs)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  cmake *pcVar3;
  pointer pcVar4;
  pointer pLVar5;
  long *plVar6;
  __type _Var7;
  bool bVar8;
  TargetType TVar9;
  string *psVar10;
  string *psVar11;
  unsigned_long uVar12;
  undefined8 extraout_RAX;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var13;
  cmGlobalGenerator *pcVar14;
  string *b;
  undefined7 extraout_var;
  _Rb_tree_node_base *p_Var15;
  pointer this_00;
  long *plVar16;
  pointer pLVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  bool bVar20;
  pair<unsigned_long,_bool> pVar21;
  string_view str;
  string_view str_00;
  string_view prefix;
  string_view prefix_00;
  bool local_179;
  uint local_178;
  char local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  cmLinkItem *local_168;
  string *local_160;
  allocator<char> local_152;
  allocator<char> local_151;
  size_t local_150;
  pair<unsigned_long,_bool> groupIndex;
  undefined1 local_138 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> indexes;
  size_t dependee_index;
  _Base_ptr local_e8;
  _Base_ptr local_e0;
  unsigned_long index;
  undefined1 local_b8 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> groupItems;
  map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  
  dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dependSets._M_t._M_impl.super__Rb_tree_header._M_header;
  dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dependSets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groupIndex.first = 0xffffffffffffffff;
  groupIndex.second = false;
  groupItems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  groupItems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  groupItems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (libs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pcVar1 = (libs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_e8 = (_Base_ptr)&this->LinkLanguage;
  local_b8._16_8_ = &this->OriginalEntries;
  local_b8._24_8_ = &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header;
  local_e0 = (_Base_ptr)(depender_index * 0x68);
  local_178 = 0;
  local_150 = depender_index;
  dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    p_Var15 = dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (this_00 == pcVar1) {
      for (; (_Rb_tree_header *)p_Var15 != &dependSets._M_t._M_impl.super__Rb_tree_header;
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
        std::
        vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
        push_back(&(this->InferredDependSets).
                   super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                   ._M_impl.super__Vector_impl_data._M_start[*(long *)(p_Var15 + 1)].
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                  ,(value_type *)&p_Var15[1]._M_parent);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&groupItems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
      ::~_Rb_tree(&dependSets._M_t);
      return;
    }
    local_168 = this_00;
    psVar10 = cmLinkItem::AsStr_abi_cxx11_(this_00);
    psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    _Var7 = std::operator==(psVar10,psVar11);
    if ((!_Var7) &&
       (psVar10 = cmLinkItem::AsStr_abi_cxx11_(local_168), psVar10->_M_string_length != 0)) {
      bVar20 = local_150 != 0xffffffffffffffff;
      local_170 = &local_168->Feature;
      bVar8 = std::operator!=(local_170,&cmLinkItem::DEFAULT_abi_cxx11_);
      if (bVar8 && bVar20) {
        pLVar17 = (this->EntryList).
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = *(cmGeneratorTarget **)((long)&local_e0[1]._M_left + (long)pLVar17);
        if (((pcVar2 != (cmGeneratorTarget *)0x0) &&
            (bVar8 = cmGeneratorTarget::IsImported(pcVar2), bVar8)) &&
           (bVar8 = anon_unknown.dwarf_1a7425e::IsFeatureSupported
                              (this->Makefile,(string *)local_e8,local_170), !bVar8)) {
          pcVar3 = this->CMakeInstance;
          psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                              (*(cmGeneratorTarget **)((long)&local_e0[1]._M_left + (long)pLVar17));
          cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[69],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[21],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[21],std::__cxx11::string_const&,char_const(&)[13]>
                    ((string *)&indexes,(char (*) [24])"The \'IMPORTED\' target \'",psVar10,
                     (char (*) [69])
                     "\' uses the generator-expression \'$<LINK_LIBRARY>\' with the feature \'",
                     local_170,
                     (char (*) [93])
                     "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     (char (*) [21])0x69cab3,local_170,(char (*) [14])"\" and \"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     (char (*) [21])0x69cab3,local_170,(char (*) [13])"_SUPPORTED\"?");
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_138);
          cmake::IssueMessage(pcVar3,AUTHOR_ERROR,(string *)&indexes,
                              (cmListFileBacktrace *)local_138);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
          std::__cxx11::string::~string((string *)&indexes);
        }
      }
      psVar10 = cmLinkItem::AsStr_abi_cxx11_(local_168);
      str._M_str = (psVar10->_M_dataplus)._M_p;
      str._M_len = psVar10->_M_string_length;
      prefix._M_str = DAT_0095b7d8;
      prefix._M_len = (anonymous_namespace)::LG_BEGIN;
      bVar8 = cmHasPrefix(str,prefix);
      if (bVar8) {
        psVar10 = cmLinkItem::AsStr_abi_cxx11_(local_168);
        if ((psVar10->_M_string_length != 0) &&
           ((psVar10->_M_dataplus)._M_p[psVar10->_M_string_length - 1] == '>')) {
          pVar21 = AddLinkEntry(this,local_168,0xffffffffffffffff);
          uVar12 = pVar21.first;
          groupIndex.second = pVar21.second;
          groupIndex.first = uVar12;
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pLVar17 = (this->EntryList).
                      super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            psVar10 = cmLinkItem::AsStr_abi_cxx11_(local_168);
            anon_unknown.dwarf_1a7425e::ExtractGroupFeature((string *)&indexes,psVar10);
            std::__cxx11::string::operator=((string *)&pLVar17[uVar12].Feature,(string *)&indexes);
            std::__cxx11::string::~string((string *)&indexes);
          }
          if (local_150 == 0xffffffffffffffff) {
            local_178 = 0xffffff01;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8._16_8_,
                       &groupIndex.first);
          }
          else {
            pcVar4 = (this->EntryConstraintGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
            index = index & 0xffffffffffffff00;
            indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&indexes);
            std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
            emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
                      ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar4 + local_150),
                       &groupIndex.first,(bool *)local_138,(bool *)&index,
                       (cmListFileBacktrace *)&indexes);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
            local_178 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          goto LAB_00480a8e;
        }
      }
      psVar10 = cmLinkItem::AsStr_abi_cxx11_(local_168);
      str_00._M_str = (psVar10->_M_dataplus)._M_p;
      str_00._M_len = psVar10->_M_string_length;
      prefix_00._M_str = DAT_0095b7e8;
      prefix_00._M_len = (anonymous_namespace)::LG_END;
      bVar8 = cmHasPrefix(str_00,prefix_00);
      if (bVar8) {
        psVar10 = cmLinkItem::AsStr_abi_cxx11_(local_168);
        if ((psVar10->_M_string_length != 0) &&
           ((psVar10->_M_dataplus)._M_p[psVar10->_M_string_length - 1] == '>')) {
          dependee_index = groupIndex.first;
          if (groupIndex.second == true) {
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            ::
            _M_emplace_unique<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                        *)&this->GroupItems,&groupIndex.first,&groupItems);
          }
          groupIndex.first = 0xffffffffffffffff;
          groupIndex.second = false;
          if (groupItems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              groupItems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            groupItems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 groupItems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          local_178 = 0;
          goto LAB_00480a8e;
        }
      }
      uVar12 = groupIndex.first;
      if ((local_150 != 0xffffffffffffffff) && ((local_178 & 1) != 0)) {
        pLVar17 = (this->EntryList).
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = *(cmGeneratorTarget **)((long)&local_e0[1]._M_left + (long)pLVar17);
        if (pcVar2 != (cmGeneratorTarget *)0x0) {
          bVar8 = cmGeneratorTarget::IsImported(pcVar2);
          if (bVar8) {
            psVar10 = &pLVar17[uVar12].Feature;
            bVar8 = anon_unknown.dwarf_1a7425e::IsGroupFeatureSupported
                              (this->Makefile,(string *)local_e8,psVar10);
            if (!bVar8) {
              pcVar3 = this->CMakeInstance;
              psVar11 = cmGeneratorTarget::GetName_abi_cxx11_
                                  (*(cmGeneratorTarget **)
                                    ((long)&local_e0[1]._M_left + (long)pLVar17));
              cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>
                        ((string *)&indexes,(char (*) [24])"The \'IMPORTED\' target \'",psVar11,
                         (char (*) [67])
                         "\' uses the generator-expression \'$<LINK_GROUP>\' with the feature \'",
                         psVar10,(char (*) [93])
                                 "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e8,(char (*) [19])0x69cd7c,psVar10,(char (*) [14])"\" and \"CMAKE_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,(char (*) [19])0x69cd7c,psVar10,(char (*) [13])"_SUPPORTED\"?");
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_138);
              cmake::IssueMessage(pcVar3,AUTHOR_ERROR,(string *)&indexes,
                                  (cmListFileBacktrace *)local_138);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
              std::__cxx11::string::~string((string *)&indexes);
            }
          }
        }
      }
      pVar21 = AddLinkEntry(this,local_168,groupIndex.first);
      dependee_index = pVar21.first;
      pLVar17 = (this->EntryList).
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                ._M_impl.super__Vector_impl_data._M_start + dependee_index;
      local_160 = GetCurrentFeature(this,(string *)pLVar17,local_170);
      if ((local_178 & 1) == 0) {
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_00480492;
      }
      else if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if ((pLVar17->Target != (cmGeneratorTarget *)0x0) &&
           ((TVar9 = cmGeneratorTarget::GetType(pLVar17->Target), TVar9 == OBJECT_LIBRARY ||
            (TVar9 = cmGeneratorTarget::GetType(pLVar17->Target), TVar9 == INTERFACE_LIBRARY)))) {
          uVar12 = groupIndex.first;
          pcVar3 = this->CMakeInstance;
          pLVar5 = (this->EntryList).
                   super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          TVar9 = cmGeneratorTarget::GetType(pLVar17->Target);
          psVar10 = &pLVar5[uVar12].Feature;
          index = 0x6a0a07;
          if (TVar9 == OBJECT_LIBRARY) {
            index = 0x68c758;
          }
          cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char_const(&)[50],cm::static_string_view_const&,std::__cxx11::string_const&,char_const(&)[32],char_const*,char_const(&)[11],std::__cxx11::string&,char_const(&)[3]>
                    ((string *)&indexes,(char (*) [14])"The feature \'",psVar10,
                     (char (*) [50])"\', specified as part of a generator-expression \'$",
                     (static_string_view *)&(anonymous_namespace)::LG_BEGIN,psVar10,
                     (char (*) [32])">\', will not be applied to the ",(char **)&index,
                     (char (*) [11])" library \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pLVar17,
                     (char (*) [3])0x6c1391);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_138);
          cmake::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)&indexes,
                              (cmListFileBacktrace *)local_138);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
          std::__cxx11::string::~string((string *)&indexes);
        }
LAB_00480492:
        bVar8 = std::operator!=(local_160,&cmLinkItem::DEFAULT_abi_cxx11_);
        if (((bVar8) && (pLVar17->Target != (cmGeneratorTarget *)0x0)) &&
           ((TVar9 = cmGeneratorTarget::GetType(pLVar17->Target), TVar9 == OBJECT_LIBRARY ||
            (TVar9 = cmGeneratorTarget::GetType(pLVar17->Target), TVar9 == INTERFACE_LIBRARY)))) {
          pcVar3 = this->CMakeInstance;
          TVar9 = cmGeneratorTarget::GetType(pLVar17->Target);
          index = 0x6a0a07;
          if (TVar9 == OBJECT_LIBRARY) {
            index = 0x68c758;
          }
          cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char_const(&)[64],std::__cxx11::string_const&,char_const(&)[32],char_const*,char_const(&)[11],std::__cxx11::string&,char_const(&)[3]>
                    ((string *)&indexes,(char (*) [14])"The feature \'",local_160,
                     (char (*) [64])
                     "\', specified as part of a generator-expression \'$<LINK_LIBRARY:",local_160,
                     (char (*) [32])">\', will not be applied to the ",(char **)&index,
                     (char (*) [11])" library \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pLVar17,
                     (char (*) [3])0x6c1391);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_138);
          cmake::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)&indexes,
                              (cmListFileBacktrace *)local_138);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
          std::__cxx11::string::~string((string *)&indexes);
        }
        std::__cxx11::string::_M_assign((string *)&pLVar17->Feature);
      }
      if ((pLVar17->Target == (cmGeneratorTarget *)0x0) ||
         ((TVar9 = cmGeneratorTarget::GetType(pLVar17->Target), TVar9 != OBJECT_LIBRARY &&
          (TVar9 = cmGeneratorTarget::GetType(pLVar17->Target), TVar9 != INTERFACE_LIBRARY)))) {
        if ((local_178 & 1) != 0) {
          pbVar18 = &(this->EntryList).
                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start[groupIndex.first].Feature;
          local_170 = pbVar18;
          for (pcVar14 = (cmGlobalGenerator *)
                         (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              pcVar14 != (cmGlobalGenerator *)local_b8._24_8_;
              pcVar14 = (cmGlobalGenerator *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar14))
          {
            psVar10 = &(this->EntryList).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(pcVar14->MakeSilentFlag).field_2._M_allocated_capacity].Feature;
            _Var7 = std::operator==(psVar10,pbVar18);
            if ((!_Var7) &&
               (_Var13 = std::
                         __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                   (*(undefined8 *)((long)&(pcVar14->MakeSilentFlag).field_2 + 8),
                                    pcVar14->RecursionDepth,&dependee_index),
               _Var13._M_current != (unsigned_long *)pcVar14->RecursionDepth)) {
              pcVar3 = this->CMakeInstance;
              psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
              index = CONCAT71(index._1_7_,0x27);
              local_b8[0] = true;
              cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[26],std::__cxx11::string&,char_const(&)[38],std::__cxx11::string_const&,char,char_const(&)[42],std::__cxx11::string_const&,char,char_const(&)[24]>
                        ((string *)&indexes,(char (*) [28])"Impossible to link target \'",psVar11,
                         (char (*) [26])"\' because the link item \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pLVar17,(char (*) [38])"\', specified with the group feature \'",local_170,
                         (char *)&index,(char (*) [42])", has already occurred with the feature \'",
                         psVar10,local_b8,(char (*) [24])", which is not allowed.");
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_138);
              cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)&indexes,
                                  (cmListFileBacktrace *)local_138);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
              std::__cxx11::string::~string((string *)&indexes);
              pbVar18 = local_170;
            }
          }
        }
        psVar10 = &pLVar17->Feature;
        bVar8 = std::operator!=(psVar10,local_160);
        if (bVar8) {
          pcVar3 = this->CMakeInstance;
          b = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          psVar11 = local_160;
          _Var7 = std::operator==(local_160,&cmLinkItem::DEFAULT_abi_cxx11_);
          local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT71(local_170._1_7_,_Var7);
          if (_Var7) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_138,"without any feature or \'DEFAULT\' feature",&local_151);
          }
          else {
            local_179 = true;
            cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char>
                      ((string *)local_138,(char (*) [19])0x6c99c2,psVar11,&local_179);
          }
          _Var7 = std::operator==(psVar10,&cmLinkItem::DEFAULT_abi_cxx11_);
          local_160 = (string *)CONCAT71(local_160._1_7_,_Var7);
          if (_Var7) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&index,"without any feature or \'DEFAULT\' feature",&local_152);
          }
          else {
            local_171 = '\'';
            cmStrCat<char_const(&)[19],std::__cxx11::string&,char>
                      ((string *)&index,(char (*) [19])0x6c99c2,psVar10,&local_171);
          }
          cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[26],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[24]>
                    ((string *)&indexes,(char (*) [28])"Impossible to link target \'",b,
                     (char (*) [26])"\' because the link item \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pLVar17,
                     (char (*) [14])"\', specified ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (char (*) [24])", has already occurred ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                     (char (*) [24])", which is not allowed.");
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_b8);
          cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)&indexes,(cmListFileBacktrace *)local_b8)
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
          std::__cxx11::string::~string((string *)&indexes);
          std::__cxx11::string::~string((string *)&index);
          std::__cxx11::string::~string((string *)local_138);
        }
      }
      if ((local_178 & 1) == 0) {
        indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pcVar14 = (cmGlobalGenerator *)
                  (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((ulong)local_170 & 0xffffffff00000000);
        while( true ) {
          if (pcVar14 == (cmGlobalGenerator *)local_b8._24_8_) break;
          plVar16 = *(long **)((long)&(pcVar14->MakeSilentFlag).field_2 + 8);
          plVar6 = (long *)pcVar14->RecursionDepth;
          do {
            if (plVar16 == plVar6) goto LAB_00480907;
            _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pLVar17,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((this->EntryList).
                                        super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start + *plVar16));
            plVar16 = plVar16 + 1;
          } while (!_Var7);
          local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(local_170._4_4_,(int)CONCAT71(extraout_var,1));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&indexes,&(pcVar14->MakeSilentFlag).field_2._M_allocated_capacity);
LAB_00480907:
          pcVar14 = (cmGlobalGenerator *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar14);
        }
        pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (((ulong)local_170 & 1) == 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                     &dependee_index);
          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar19 != pbVar18;
            pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pbVar19->_M_string_length) {
          index = (unsigned_long)(pbVar19->_M_dataplus)._M_p;
          if (local_150 == 0xffffffffffffffff) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8._16_8_,
                       &index);
            p_Var15 = dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          else {
            pcVar4 = (this->EntryConstraintGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_b8[0] = false;
            local_179 = false;
            local_138._0_8_ = (cmTarget *)0x0;
            local_138._8_8_ = (cmMakefile *)0x0;
            local_170 = pbVar19;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_138);
            std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
            emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
                      ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar4 + local_150),
                       &index,(bool *)local_b8,&local_179,(cmListFileBacktrace *)local_138);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
            p_Var15 = dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pbVar19 = local_170;
          }
          for (; (_Rb_tree_header *)p_Var15 != &dependSets._M_t._M_impl.super__Rb_tree_header;
              p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
            pLVar17 = (this->EntryList).
                      super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (((pLVar17[index].Target == (cmGeneratorTarget *)0x0) &&
                (1 < pLVar17[index].Kind - Flag)) && (dependee_index != *(size_t *)(p_Var15 + 1))) {
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&p_Var15[1]._M_parent,&index);
            }
          }
          if ((this->InferredDependSets).
              super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
              ._M_impl.super__Vector_impl_data._M_start[index].Initialized != false) {
            std::
            map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
            ::operator[](&dependSets,&index);
          }
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&groupItems,&dependee_index);
      }
    }
LAB_00480a8e:
    this_00 = local_168 + 1;
  } while( true );
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(size_t depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<size_t, DependSet> dependSets;

  bool inGroup = false;
  std::pair<size_t, bool> groupIndex{
    cmComputeComponentGraph::INVALID_COMPONENT, false
  };
  std::vector<size_t> groupItems;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    // emit a warning if an undefined feature is used as part of
    // an imported target
    if (item.Feature != LinkEntry::DEFAULT &&
        depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
      const auto& depender = this->EntryList[depender_index];
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsFeatureSupported(this->Makefile, this->LinkLanguage,
                              item.Feature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_LIBRARY>' with "
                   "the feature '",
                   item.Feature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_LIBRARY_USING_", item.Feature,
                   "\" and \"CMAKE_", this->LinkLanguage,
                   "_LINK_LIBRARY_USING_", item.Feature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    if (cmHasPrefix(item.AsStr(), LG_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      groupIndex = this->AddLinkEntry(item);
      if (groupIndex.second) {
        LinkEntry& entry = this->EntryList[groupIndex.first];
        entry.Feature = ExtractGroupFeature(item.AsStr());
      }
      inGroup = true;
      if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
        this->EntryConstraintGraph[depender_index].emplace_back(
          groupIndex.first, false, false, cmListFileBacktrace());
      } else {
        // This is a direct dependency of the target being linked.
        this->OriginalEntries.push_back(groupIndex.first);
      }
      continue;
    }

    size_t dependee_index;

    if (cmHasPrefix(item.AsStr(), LG_END) && cmHasSuffix(item.AsStr(), '>')) {
      dependee_index = groupIndex.first;
      if (groupIndex.second) {
        this->GroupItems.emplace(groupIndex.first, groupItems);
      }
      inGroup = false;
      groupIndex = std::make_pair(-1, false);
      groupItems.clear();
      continue;
    }

    if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT &&
        inGroup) {
      const auto& depender = this->EntryList[depender_index];
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsGroupFeatureSupported(this->Makefile, this->LinkLanguage,
                                   groupFeature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_GROUP>' with "
                   "the feature '",
                   groupFeature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_GROUP_USING_", groupFeature,
                   "\" and \"CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_",
                   groupFeature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    // Add a link entry for this item.
    auto ale = this->AddLinkEntry(item, groupIndex.first);
    dependee_index = ale.first;
    LinkEntry& entry = this->EntryList[dependee_index];
    auto const& itemFeature =
      this->GetCurrentFeature(entry.Item.Value, item.Feature);
    if (inGroup && ale.second && entry.Target != nullptr &&
        (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY ||
         entry.Target->GetType() ==
           cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      this->CMakeInstance->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          "The feature '", groupFeature,
          "', specified as part of a generator-expression "
          "'$",
          LG_BEGIN, groupFeature, ">', will not be applied to the ",
          (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY
             ? "OBJECT"
             : "INTERFACE"),
          " library '", entry.Item.Value, "'."),
        this->Target->GetBacktrace());
    }
    if (ale.second) {
      // current item not yet defined
      if (itemFeature != LinkEntry::DEFAULT && entry.Target != nullptr &&
          (entry.Target->GetType() ==
             cmStateEnums::TargetType::OBJECT_LIBRARY ||
           entry.Target->GetType() ==
             cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("The feature '", itemFeature,
                   "', specified as part of a generator-expression "
                   "'$<LINK_LIBRARY:",
                   itemFeature, ">', will not be applied to the ",
                   (entry.Target->GetType() ==
                        cmStateEnums::TargetType::OBJECT_LIBRARY
                      ? "OBJECT"
                      : "INTERFACE"),
                   " library '", entry.Item.Value, "'."),
          this->Target->GetBacktrace());
      }
      entry.Feature = itemFeature;
    }

    bool supportedItem = entry.Target == nullptr ||
      (entry.Target->GetType() != cmStateEnums::TargetType::OBJECT_LIBRARY &&
       entry.Target->GetType() != cmStateEnums::TargetType::INTERFACE_LIBRARY);

    if (supportedItem) {
      if (inGroup) {
        const auto& currentFeature = this->EntryList[groupIndex.first].Feature;
        for (const auto& g : this->GroupItems) {
          const auto& groupFeature = this->EntryList[g.first].Feature;
          if (groupFeature == currentFeature) {
            continue;
          }
          if (std::find(g.second.cbegin(), g.second.cend(), dependee_index) !=
              g.second.cend()) {
            this->CMakeInstance->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("Impossible to link target '", this->Target->GetName(),
                       "' because the link item '", entry.Item.Value,
                       "', specified with the group feature '", currentFeature,
                       '\'', ", has already occurred with the feature '",
                       groupFeature, '\'', ", which is not allowed."),
              this->Target->GetBacktrace());
            continue;
          }
        }
      }
      if (entry.Feature != itemFeature) {
        // incompatibles features occurred
        this->CMakeInstance->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Impossible to link target '", this->Target->GetName(),
                   "' because the link item '", entry.Item.Value,
                   "', specified ",
                   (itemFeature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", itemFeature, '\'')),
                   ", has already occurred ",
                   (entry.Feature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", entry.Feature, '\'')),
                   ", which is not allowed."),
          this->Target->GetBacktrace());
      }
    }

    if (inGroup) {
      // store item index for dependencies handling
      groupItems.push_back(dependee_index);
    } else {
      std::vector<size_t> indexes;
      bool entryHandled = false;
      // search any occurrence of the library in already defined groups
      for (const auto& group : this->GroupItems) {
        for (auto index : group.second) {
          if (entry.Item.Value == this->EntryList[index].Item.Value) {
            indexes.push_back(group.first);
            entryHandled = true;
            break;
          }
        }
      }
      if (!entryHandled) {
        indexes.push_back(dependee_index);
      }

      for (auto index : indexes) {
        // The dependee must come after the depender.
        if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
          this->EntryConstraintGraph[depender_index].emplace_back(
            index, false, false, cmListFileBacktrace());
        } else {
          // This is a direct dependency of the target being linked.
          this->OriginalEntries.push_back(index);
        }

        // Update the inferred dependencies for earlier items.
        for (auto& dependSet : dependSets) {
          // Add this item to the inferred dependencies of other items.
          // Target items are never inferred dependees because unknown
          // items are outside libraries that should not be depending on
          // targets.
          if (!this->EntryList[index].Target &&
              this->EntryList[index].Kind != LinkEntry::Flag &&
              this->EntryList[index].Kind != LinkEntry::Group &&
              dependee_index != dependSet.first) {
            dependSet.second.insert(index);
          }
        }

        // If this item needs to have dependencies inferred, do so.
        if (this->InferredDependSets[index].Initialized) {
          // Make sure an entry exists to hold the set for the item.
          dependSets[index];
        }
      }
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first].push_back(dependSet.second);
  }
}